

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::cmFindPackageCommand(cmFindPackageCommand *this)

{
  _Rb_tree_header *p_Var1;
  
  cmFindCommon::cmFindCommon(&this->super_cmFindCommon);
  (this->super_cmFindCommon).super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmFindPackageCommand_0072e2e0;
  (this->OriginalDefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OriginalDefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->OriginalDefs)._M_t._M_impl.super__Rb_tree_header;
  (this->OriginalDefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->OriginalDefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->OriginalDefs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Name)._M_dataplus._M_p = (pointer)&(this->Name).field_2;
  (this->Name)._M_string_length = 0;
  (this->Name).field_2._M_local_buf[0] = '\0';
  (this->Variable)._M_dataplus._M_p = (pointer)&(this->Variable).field_2;
  (this->Variable)._M_string_length = 0;
  (this->Variable).field_2._M_local_buf[0] = '\0';
  (this->Version)._M_dataplus._M_p = (pointer)&(this->Version).field_2;
  (this->Version)._M_string_length = 0;
  (this->Version).field_2._M_local_buf[0] = '\0';
  (this->FileFound)._M_dataplus._M_p = (pointer)&(this->FileFound).field_2;
  (this->FileFound)._M_string_length = 0;
  (this->FileFound).field_2._M_local_buf[0] = '\0';
  (this->VersionFound)._M_dataplus._M_p = (pointer)&(this->VersionFound).field_2;
  (this->VersionFound)._M_string_length = 0;
  (this->VersionFound).field_2._M_local_buf[0] = '\0';
  (this->LibraryArchitecture)._M_dataplus._M_p = (pointer)&(this->LibraryArchitecture).field_2;
  (this->LibraryArchitecture)._M_string_length = 0;
  (this->LibraryArchitecture).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->IgnoredPaths)._M_t._M_impl.super__Rb_tree_header;
  (this->IgnoredPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->IgnoredPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Configs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Configs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Configs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Names).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->IgnoredPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->IgnoredPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->IgnoredPaths)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ConsideredConfigs).
  super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ConsideredConfigs).
  super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ConsideredConfigs).
  super__Vector_base<cmFindPackageCommand::ConfigFileInfo,_std::allocator<cmFindPackageCommand::ConfigFileInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::assign((char *)&(this->super_cmFindCommon).CMakePathName);
  this->NoUserRegistry = false;
  this->NoSystemRegistry = false;
  this->Quiet = false;
  this->Required = false;
  this->UseConfigFiles = true;
  this->UseFindModules = true;
  this->DebugMode = false;
  this->UseLib32Paths = false;
  this->UseLib64Paths = false;
  this->UseLibx32Paths = false;
  this->PolicyScope = true;
  this->RequiredCMakeVersion = 0;
  this->SortOrder = None;
  this->SortDirection = Asc;
  this->VersionMajor = 0;
  this->VersionMinor = 0;
  this->VersionPatch = 0;
  this->VersionTweak = 0;
  *(undefined8 *)((long)&this->VersionTweak + 1) = 0;
  this->VersionFoundMajor = 0;
  this->VersionFoundMinor = 0;
  this->VersionFoundPatch = 0;
  this->VersionFoundTweak = 0;
  this->VersionFoundCount = 0;
  AppendSearchPathGroups(this);
  return;
}

Assistant:

cmFindPackageCommand::cmFindPackageCommand()
{
  this->CMakePathName = "PACKAGE";
  this->Quiet = false;
  this->Required = false;
  this->NoUserRegistry = false;
  this->NoSystemRegistry = false;
  this->UseConfigFiles = true;
  this->UseFindModules = true;
  this->DebugMode = false;
  this->UseLib32Paths = false;
  this->UseLib64Paths = false;
  this->UseLibx32Paths = false;
  this->PolicyScope = true;
  this->VersionMajor = 0;
  this->VersionMinor = 0;
  this->VersionPatch = 0;
  this->VersionTweak = 0;
  this->VersionCount = 0;
  this->VersionExact = false;
  this->VersionFoundMajor = 0;
  this->VersionFoundMinor = 0;
  this->VersionFoundPatch = 0;
  this->VersionFoundTweak = 0;
  this->VersionFoundCount = 0;
  this->RequiredCMakeVersion = 0;
  this->SortOrder = None;
  this->SortDirection = Asc;
  this->AppendSearchPathGroups();
}